

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtThreadSupportPosix.cpp
# Opt level: O2

int __thiscall cbtThreadSupportPosix::waitForResponse(cbtThreadSupportPosix *this)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  size_t t;
  ulong uVar6;
  long lVar7;
  
  iVar3 = sem_wait((sem_t *)this->m_mainSemaphore);
  if (iVar3 != 0) {
    uVar4 = sem_wait((sem_t *)this->m_mainSemaphore);
    puVar5 = (uint *)__errno_location();
    printf("PThread problem at line %i in file %s: %i %d\n",0xea,
           "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/bullet/LinearMath/TaskScheduler/cbtThreadSupportPosix.cpp"
           ,(ulong)uVar4,(ulong)*puVar5);
  }
  lVar7 = 0;
  iVar3 = -1;
  uVar6 = 0;
  do {
    if ((ulong)(long)(this->m_activeThreadStatus).m_size <= uVar6) {
LAB_00e1c81a:
      (this->m_activeThreadStatus).m_data[iVar3].m_status = 0;
      bVar2 = (byte)iVar3 & 0x3f;
      this->m_startedThreadsMask =
           this->m_startedThreadsMask & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      return iVar3;
    }
    (*this->m_cs->_vptr_cbtCriticalSection[2])();
    iVar1 = (this->m_activeThreadStatus).m_data[lVar7 >> 0x20].m_status;
    (*this->m_cs->_vptr_cbtCriticalSection[3])();
    if (iVar1 == 2) {
      iVar3 = (int)uVar6;
      goto LAB_00e1c81a;
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x100000000;
  } while( true );
}

Assistant:

int cbtThreadSupportPosix::waitForResponse()
{
	///We should wait for (one of) the first tasks to finish (or other SPU messages), and report its response
	///A possible response can be 'yes, SPU handled it', or 'no, please do a PPU fallback'

	cbtAssert(m_activeThreadStatus.size());

	// wait for any of the threads to finish
	checkPThreadFunction(sem_wait(m_mainSemaphore));
	// get at least one thread which has finished
	size_t last = -1;

	for (size_t t = 0; t < size_t(m_activeThreadStatus.size()); ++t)
	{
		m_cs->lock();
		bool hasFinished = (2 == m_activeThreadStatus[t].m_status);
		m_cs->unlock(); 
		if (hasFinished)
		{
			last = t;
			break;
		}
	}

	cbtThreadStatus& threadStatus = m_activeThreadStatus[last];

	cbtAssert(threadStatus.m_status > 1);
	threadStatus.m_status = 0;

	// need to find an active spu
	cbtAssert(last >= 0);
	m_startedThreadsMask &= ~(UINT64(1) << last);

	return last;
}